

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_filter.c
# Opt level: O0

void FilterSegment(double *in_data,PitchFilterParam *parameters,double *out_data,
                  double (*out_dg) [264])

{
  int iVar1;
  int local_5c;
  int m_tmp;
  int lag_index;
  int pos_lag;
  int pos;
  double sum2;
  double sum;
  int local_30;
  int j;
  int m;
  int n;
  double (*out_dg_local) [264];
  double *out_data_local;
  PitchFilterParam *parameters_local;
  double *in_data_local;
  
  lag_index = parameters->index + 0xbe;
  m_tmp = lag_index - parameters->lag_offset;
  for (j = 0; j < parameters->num_samples; j = j + 1) {
    for (local_30 = 4; 0 < local_30; local_30 = local_30 + -1) {
      parameters->damper_state[local_30] = parameters->damper_state[local_30 + -1];
    }
    sum2 = 0.0;
    for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
      sum2 = parameters->buffer[m_tmp + local_30] * parameters->interpol_coeff[local_30] + sum2;
    }
    parameters->damper_state[0] = parameters->gain * sum2;
    if (parameters->mode == kPitchFilterPreGain) {
      iVar1 = parameters->index - parameters->lag_offset;
      if (iVar1 < 0) {
        local_5c = -iVar1;
      }
      else {
        local_5c = 0;
      }
      for (local_30 = 4; 0 < local_30; local_30 = local_30 + -1) {
        for (sum._4_4_ = 0; sum._4_4_ < 4; sum._4_4_ = sum._4_4_ + 1) {
          parameters->damper_state_dg[sum._4_4_][local_30] =
               parameters->damper_state_dg[sum._4_4_][local_30 + -1];
        }
      }
      for (sum._4_4_ = 0; sum._4_4_ < parameters->sub_frame + 1; sum._4_4_ = sum._4_4_ + 1) {
        _pos_lag = 0.0;
        for (local_30 = 8; local_5c <= local_30; local_30 = local_30 + -1) {
          _pos_lag = out_dg[sum._4_4_][iVar1 + local_30] * parameters->interpol_coeff[local_30] +
                     _pos_lag;
        }
        parameters->damper_state_dg[sum._4_4_][0] =
             parameters->gain_mult[sum._4_4_] * sum2 + parameters->gain * _pos_lag;
      }
      for (sum._4_4_ = 0; sum._4_4_ < parameters->sub_frame + 1; sum._4_4_ = sum._4_4_ + 1) {
        sum2 = 0.0;
        for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
          sum2 = -parameters->damper_state_dg[sum._4_4_][local_30] * kDampFilter[local_30] + sum2;
        }
        out_dg[sum._4_4_][parameters->index] = sum2;
      }
    }
    sum2 = 0.0;
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      sum2 = parameters->damper_state[local_30] * kDampFilter[local_30] + sum2;
    }
    out_data[parameters->index] = in_data[parameters->index] - sum2;
    parameters->buffer[lag_index] = in_data[parameters->index] + out_data[parameters->index];
    parameters->index = parameters->index + 1;
    lag_index = lag_index + 1;
    m_tmp = m_tmp + 1;
  }
  return;
}

Assistant:

static void FilterSegment(const double* in_data, PitchFilterParam* parameters,
                          double* out_data,
                          double out_dg[][PITCH_FRAME_LEN + QLOOKAHEAD]) {
  int n;
  int m;
  int j;
  double sum;
  double sum2;
  /* Index of |parameters->buffer| where the output is written to. */
  int pos = parameters->index + PITCH_BUFFSIZE;
  /* Index of |parameters->buffer| where samples are read for fractional-lag
   * computation. */
  int pos_lag = pos - parameters->lag_offset;

  for (n = 0; n < parameters->num_samples; ++n) {
    /* Shift low pass filter states. */
    for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
      parameters->damper_state[m] = parameters->damper_state[m - 1];
    }
    /* Filter to get fractional pitch. */
    sum = 0.0;
    for (m = 0; m < PITCH_FRACORDER; ++m) {
      sum += parameters->buffer[pos_lag + m] * parameters->interpol_coeff[m];
    }
    /* Multiply with gain. */
    parameters->damper_state[0] = parameters->gain * sum;

    if (parameters->mode == kPitchFilterPreGain) {
      int lag_index = parameters->index - parameters->lag_offset;
      int m_tmp = (lag_index < 0) ? -lag_index : 0;
      /* Update the damper state for the new sample. */
      for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
        for (j = 0; j < 4; ++j) {
          parameters->damper_state_dg[j][m] =
              parameters->damper_state_dg[j][m - 1];
        }
      }

      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        /* Filter for fractional pitch. */
        sum2 = 0.0;
        for (m = PITCH_FRACORDER-1; m >= m_tmp; --m) {
          /* |lag_index + m| is always larger than or equal to zero, see how
           * m_tmp is computed. This is equivalent to assume samples outside
           * |out_dg[j]| are zero. */
          sum2 += out_dg[j][lag_index + m] * parameters->interpol_coeff[m];
        }
        /* Add the contribution of differential gain change. */
        parameters->damper_state_dg[j][0] = parameters->gain_mult[j] * sum +
            parameters->gain * sum2;
      }

      /* Filter with damping filter, and store the results. */
      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        sum = 0.0;
        for (m = 0; m < PITCH_DAMPORDER; ++m) {
          sum -= parameters->damper_state_dg[j][m] * kDampFilter[m];
        }
        out_dg[j][parameters->index] = sum;
      }
    }
    /* Filter with damping filter. */
    sum = 0.0;
    for (m = 0; m < PITCH_DAMPORDER; ++m) {
      sum += parameters->damper_state[m] * kDampFilter[m];
    }

    /* Subtract from input and update buffer. */
    out_data[parameters->index] = in_data[parameters->index] - sum;
    parameters->buffer[pos] = in_data[parameters->index] +
        out_data[parameters->index];

    ++parameters->index;
    ++pos;
    ++pos_lag;
  }
  return;
}